

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::
FormatForComparisonFailureMessage<std::variant<int,float,std::__cxx11::string>,int>
          (string *__return_storage_ptr__,internal *this,
          variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value,int *param_2)

{
  int *param_1_local;
  variant<int,_float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value_local;
  
  PrintToString<std::variant<int,float,std::__cxx11::string>>
            (__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}